

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void AdditionHelper<unsigned_char,unsigned_short,0>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uchar *lhs,unsigned_short *rhs,uchar *result)

{
  byte bVar1;
  ushort uVar2;
  byte bVar3;
  undefined1 *in_RDX;
  ushort *in_RSI;
  byte *in_RDI;
  int32_t tmp;
  
  bVar1 = *in_RDI;
  uVar2 = *in_RSI;
  bVar3 = std::numeric_limits<unsigned_char>::max();
  if ((uint)bVar1 + (uint)uVar2 <= (uint)bVar3) {
    *in_RDX = (char)((uint)bVar1 + (uint)uVar2);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}